

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O0

int light_ip_flow(light_pcapng *sectionp,light_pcapng **flows,size_t *flow_count,size_t *dropped)

{
  uint32_t uVar1;
  light_boolean lVar2;
  flow_information_t *pfVar3;
  _light_pcapng *p_Var4;
  void *pvVar5;
  long *in_RCX;
  size_t *in_RDX;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  flow_information_t *to_be_deleted;
  flow_information_t *iterator;
  uint32_t index;
  _light_enhanced_packet_block *epb_1;
  _light_enhanced_packet_block *epb;
  flow_information_t *match;
  uint8_t protocol_version;
  flow_address_t flow_key;
  uint32_t type;
  light_pcapng current_block;
  flow_information_t *last_flow;
  flow_information_t *current_flow;
  uint32_t interface_list_size;
  light_pcapng *interface_list;
  light_pcapng current_interface;
  light_pcapng current_section;
  size_t skipped;
  size_t limit;
  size_t progress;
  light_pcapng section;
  uint8_t in_stack_ffffffffffffff1f;
  flow_address_t *in_stack_ffffffffffffff20;
  light_pcapng in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  light_boolean in_stack_ffffffffffffff34;
  uint uVar8;
  _light_pcapng *in_stack_ffffffffffffff38;
  flow_address_t *in_stack_ffffffffffffff40;
  uint8_t local_a9;
  address_t local_a8;
  undefined8 local_98;
  undefined8 local_90;
  uint32_t local_84;
  _light_pcapng *local_80;
  flow_information_t *local_78;
  flow_information_t *local_70;
  uint local_64;
  void *local_60;
  _light_pcapng *local_58;
  _light_pcapng *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  _light_pcapng *local_30;
  long *local_28;
  size_t *local_20;
  long *local_18;
  long *local_10;
  int local_4;
  
  local_30 = (_light_pcapng *)*in_RDI;
  local_38 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar1 = light_get_block_count((light_pcapng)*in_RDI);
  local_40 = (ulong)uVar1;
  local_48 = 0;
  lVar2 = __is_section_header(local_30);
  if (lVar2 == LIGHT_FALSE) {
    fprintf(_stderr,"Error at: %s::%s::%d, %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_manipulate.c"
            ,"light_ip_flow",0x186,"\"Invalid section header\"");
    local_4 = -1;
  }
  else {
    local_50 = local_30;
    local_58 = (_light_pcapng *)0x0;
    local_60 = (void *)0x0;
    local_64 = 0;
    local_70 = (flow_information_t *)0x0;
    local_78 = (flow_information_t *)0x0;
    local_80 = local_30->next_block;
    *local_20 = 0;
    for (; local_80 != (_light_pcapng *)0x0; local_80 = local_80->next_block) {
      local_84 = local_80->block_type;
      if (local_84 == 0xa0d0d0a) {
        *local_10 = (long)local_80;
        break;
      }
      if (local_84 == 1) {
        local_58 = local_80;
        local_60 = realloc(local_60,(ulong)(local_64 + 1) << 3);
        *(_light_pcapng **)((long)local_60 + (ulong)local_64 * 8) = local_58;
        local_64 = local_64 + 1;
      }
      else if ((local_84 == 6) || (local_84 == 3)) {
        local_a8._0_8_ = 0;
        local_a8._8_8_ = 0;
        local_98 = 0;
        local_90 = 0;
        lVar2 = __get_address((light_pcapng)0x0,in_stack_ffffffffffffff40,
                              (uint8_t *)in_stack_ffffffffffffff38);
        if (lVar2 == LIGHT_FALSE) {
          local_48 = local_48 + 1;
        }
        else {
          if (local_70 == (flow_information_t *)0x0) {
            if (local_84 == 3) {
              local_70 = __create_flow((light_pcapng)
                                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                                       ,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                       in_stack_ffffffffffffff1f);
            }
            else {
              in_stack_ffffffffffffff40 = (flow_address_t *)local_80->block_body;
              local_70 = __create_flow((light_pcapng)
                                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                                       ,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                       in_stack_ffffffffffffff1f);
            }
            local_78 = local_70;
            *local_20 = 1;
            pfVar3 = local_70;
          }
          else {
            pfVar3 = __find_flow(local_70,(flow_address_t *)&local_a8,local_a9);
          }
          if (pfVar3 == (flow_information_t *)0x0) {
            if (local_84 == 3) {
              pfVar3 = __create_flow((light_pcapng)
                                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                     in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                     in_stack_ffffffffffffff1f);
            }
            else {
              in_stack_ffffffffffffff38 = (_light_pcapng *)local_80->block_body;
              pfVar3 = __create_flow((light_pcapng)
                                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                     in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                     in_stack_ffffffffffffff1f);
            }
            local_78->next = pfVar3;
            *local_20 = *local_20 + 1;
            local_78 = pfVar3;
          }
          else {
            p_Var4 = __copy_block(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
            pfVar3->last_block->next_block = p_Var4;
            pfVar3->last_block = pfVar3->last_block->next_block;
          }
        }
      }
      local_38 = local_38 + 1;
      if (local_38 % 10000 == 0) {
        auVar6._8_4_ = (int)(local_38 >> 0x20);
        auVar6._0_8_ = local_38;
        auVar6._12_4_ = 0x45300000;
        auVar7._8_4_ = (int)(local_40 >> 0x20);
        auVar7._0_8_ = local_40;
        auVar7._12_4_ = 0x45300000;
        printf("Flow extraction progress: %.2lf [%zu / %zu]\n",
               (((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0)) /
               ((auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_40) - 4503599627370496.0))) * 100.0,local_38,
               local_40);
      }
    }
    if (local_28 != (long *)0x0) {
      *local_28 = local_48;
    }
    if (local_80 == (_light_pcapng *)0x0) {
      *local_10 = 0;
    }
    pvVar5 = calloc(*local_20,8);
    *local_18 = (long)pvVar5;
    uVar8 = 0;
    for (pfVar3 = local_70; pfVar3 != (flow_information_t *)0x0; pfVar3 = pfVar3->next) {
      *(light_pcapng *)(*local_18 + (ulong)uVar8 * 8) = pfVar3->section;
      __validate_section((_light_pcapng *)pfVar3);
      __append_address_information((light_pcapng)CONCAT44(uVar8,in_stack_ffffffffffffff30),pfVar3);
      uVar8 = uVar8 + 1;
    }
    while (pfVar3 = local_70, local_70 != (flow_information_t *)0x0) {
      local_70 = local_70->next;
      free(pfVar3);
    }
    free(local_60);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int light_ip_flow(light_pcapng *sectionp, light_pcapng **flows, size_t *flow_count, size_t *dropped)
{
	light_pcapng section = *sectionp;
	size_t progress = 0;
	size_t limit = light_get_block_count(*sectionp);
	size_t skipped = 0;

	if (__is_section_header(section) == 0) {
		PCAPNG_ERROR("Invalid section header");
		return LIGHT_INVALID_SECTION;
	}

	light_pcapng current_section = section;
	light_pcapng current_interface = NULL;
	light_pcapng *interface_list = NULL;
	uint32_t interface_list_size = 0;

	flow_information_t *current_flow = NULL;
	flow_information_t *last_flow = NULL;
	light_pcapng current_block = section->next_block;

	*flow_count = 0;

	while (current_block != NULL) {
		uint32_t type = current_block->block_type;
		if (type == LIGHT_SECTION_HEADER_BLOCK) {
			// current_section = current_block;
			*sectionp = current_block;
			break;
		}
		else if (type == LIGHT_INTERFACE_BLOCK) {
			current_interface = current_block;
			interface_list = realloc(interface_list, (interface_list_size + 1) * sizeof(light_pcapng));
			interface_list[interface_list_size] = current_interface;
			interface_list_size++;
		}
		else if (type == LIGHT_ENHANCED_PACKET_BLOCK || type == LIGHT_SIMPLE_PACKET_BLOCK) {
			flow_address_t flow_key = {0};
			uint8_t protocol_version;
			flow_information_t *match = NULL;

			if (__get_address(current_block, &flow_key, &protocol_version) == LIGHT_FALSE) {
				skipped++;
				goto iterate;
			}

			if (current_flow == NULL) { // Beginning of the trace.
				if (type == LIGHT_SIMPLE_PACKET_BLOCK) {
					current_flow = __create_flow(current_section, current_interface, &flow_key, protocol_version);
				}
				else {
					struct _light_enhanced_packet_block *epb = (struct _light_enhanced_packet_block *)current_block->block_body;
					current_flow = __create_flow(current_section, interface_list[epb->interface_id], &flow_key, protocol_version);
				}
				match = current_flow;
				last_flow = current_flow;
				*flow_count = 1;
			}
			else {
				match = __find_flow(current_flow, &flow_key, protocol_version);
			}

			if (match == NULL) {
				if (type == LIGHT_SIMPLE_PACKET_BLOCK) {
					match = __create_flow(current_section, current_interface, &flow_key, protocol_version);
				}
				else {
					struct _light_enhanced_packet_block *epb = (struct _light_enhanced_packet_block *)current_block->block_body;
					match = __create_flow(current_section, interface_list[epb->interface_id], &flow_key, protocol_version);
				}

				last_flow->next = match;
				last_flow = match;
				*flow_count += 1;
			}
			else {
				match->last_block->next_block = __copy_block(current_block, LIGHT_FALSE);
				match->last_block = match->last_block->next_block;
			}
		}
		else {
			// TODO: Append other blocks to all flows accordingly.
		}

iterate:
		progress++;
		if (progress % 10000 == 0) {
			printf("Flow extraction progress: %.2lf [%zu / %zu]\n", (double)progress / limit * 100.0, progress, limit);
		}
		current_block = current_block->next_block;
	}

	if (dropped != NULL) {
		*dropped = skipped;
	}

	// End of trace.
	if (current_block == NULL) {
		*sectionp = NULL;
	}

	*flows = calloc(*flow_count, sizeof(light_pcapng));
	uint32_t index = 0;
	flow_information_t *iterator = current_flow;

	while (iterator != NULL) {
		(*flows)[index] = iterator->section;
		__validate_section((*flows)[index]);
		__append_address_information(iterator->section, iterator);
		index++;
		iterator = iterator->next;
	}

	while (current_flow != NULL) {
		flow_information_t *to_be_deleted = current_flow;
		current_flow = current_flow->next;
		free(to_be_deleted);
	}

	free(interface_list);

	return LIGHT_SUCCESS;
}